

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void sendsuboption(Curl_easy *data,int option)

{
  TELNET *pTVar1;
  connectdata *pcVar2;
  uchar *puVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  ssize_t sVar6;
  uint *puVar7;
  connectdata *conn;
  TELNET *tn;
  uchar *uc2;
  uchar *uc1;
  unsigned_short y;
  unsigned_short x;
  int err;
  ssize_t bytes_written;
  int option_local;
  Curl_easy *data_local;
  
  pTVar1 = (data->req).p.telnet;
  pcVar2 = data->conn;
  if (option == 0x1f) {
    pTVar1->subpointer = pTVar1->subbuffer;
    if (pTVar1->subpointer < &pTVar1->subpointer) {
      puVar3 = pTVar1->subpointer;
      pTVar1->subpointer = puVar3 + 1;
      *puVar3 = 0xff;
    }
    if (pTVar1->subpointer < &pTVar1->subpointer) {
      puVar3 = pTVar1->subpointer;
      pTVar1->subpointer = puVar3 + 1;
      *puVar3 = 0xfa;
    }
    if (pTVar1->subpointer < &pTVar1->subpointer) {
      puVar3 = pTVar1->subpointer;
      pTVar1->subpointer = puVar3 + 1;
      *puVar3 = '\x1f';
    }
    uVar4 = htons(pTVar1->subopt_wsx);
    uVar5 = htons(pTVar1->subopt_wsy);
    if (pTVar1->subpointer < &pTVar1->subpointer) {
      uc1._2_1_ = (uchar)uVar4;
      puVar3 = pTVar1->subpointer;
      pTVar1->subpointer = puVar3 + 1;
      *puVar3 = uc1._2_1_;
    }
    if (pTVar1->subpointer < &pTVar1->subpointer) {
      uc1._3_1_ = (uchar)(uVar4 >> 8);
      puVar3 = pTVar1->subpointer;
      pTVar1->subpointer = puVar3 + 1;
      *puVar3 = uc1._3_1_;
    }
    if (pTVar1->subpointer < &pTVar1->subpointer) {
      uc1._0_1_ = (uchar)uVar5;
      puVar3 = pTVar1->subpointer;
      pTVar1->subpointer = puVar3 + 1;
      *puVar3 = (uchar)uc1;
    }
    if (pTVar1->subpointer < &pTVar1->subpointer) {
      uc1._1_1_ = (uchar)(uVar5 >> 8);
      puVar3 = pTVar1->subpointer;
      pTVar1->subpointer = puVar3 + 1;
      *puVar3 = uc1._1_1_;
    }
    if (pTVar1->subpointer < &pTVar1->subpointer) {
      puVar3 = pTVar1->subpointer;
      pTVar1->subpointer = puVar3 + 1;
      *puVar3 = 0xff;
    }
    if (pTVar1->subpointer < &pTVar1->subpointer) {
      puVar3 = pTVar1->subpointer;
      pTVar1->subpointer = puVar3 + 1;
      *puVar3 = 0xf0;
    }
    pTVar1->subend = pTVar1->subpointer;
    pTVar1->subpointer = pTVar1->subbuffer;
    printsub(data,0x3e,pTVar1->subbuffer + 2,
             (size_t)(pTVar1->subend + (-2 - (long)pTVar1->subpointer)));
    sVar6 = send(pcVar2->sock[0],pTVar1->subbuffer,3,0x4000);
    if (sVar6 < 0) {
      puVar7 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar7);
    }
    send_telnet_data(data,(char *)(pTVar1->subbuffer + 3),4);
    sVar6 = send(pcVar2->sock[0],pTVar1->subbuffer + 7,2,0x4000);
    if (sVar6 < 0) {
      puVar7 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar7);
    }
  }
  return;
}

Assistant:

static void sendsuboption(struct Curl_easy *data, int option)
{
  ssize_t bytes_written;
  int err;
  unsigned short x, y;
  unsigned char *uc1, *uc2;
  struct TELNET *tn = data->req.p.telnet;
  struct connectdata *conn = data->conn;

  switch(option) {
  case CURL_TELOPT_NAWS:
    /* We prepare data to be sent */
    CURL_SB_CLEAR(tn);
    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SB);
    CURL_SB_ACCUM(tn, CURL_TELOPT_NAWS);
    /* We must deal either with little or big endian processors */
    /* Window size must be sent according to the 'network order' */
    x = htons(tn->subopt_wsx);
    y = htons(tn->subopt_wsy);
    uc1 = (unsigned char *)&x;
    uc2 = (unsigned char *)&y;
    CURL_SB_ACCUM(tn, uc1[0]);
    CURL_SB_ACCUM(tn, uc1[1]);
    CURL_SB_ACCUM(tn, uc2[0]);
    CURL_SB_ACCUM(tn, uc2[1]);

    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SE);
    CURL_SB_TERM(tn);
    /* data suboption is now ready */

    printsub(data, '>', (unsigned char *)tn->subbuffer + 2,
             CURL_SB_LEN(tn)-2);

    /* we send the header of the suboption... */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer, 3);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    /* ... then the window size with the send_telnet_data() function
       to deal with 0xFF cases ... */
    send_telnet_data(data, (char *)tn->subbuffer + 3, 4);
    /* ... and the footer */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer + 7, 2);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    break;
  }
}